

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseAction(WastParser *this,ActionPtr *out_action)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  pointer pIVar4;
  pointer pGVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1eb;
  allocator<char> local_1ea;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string asStack_1c8 [32];
  iterator local_1a8;
  size_type local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  Enum local_17c;
  Var local_178;
  undefined1 local_130 [8];
  __single_object action_1;
  int local_e0;
  Var local_d8;
  undefined1 local_90 [8];
  __single_object action;
  undefined1 local_48 [8];
  Location loc;
  ActionPtr *out_action_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    TVar2 = Peek(this,0);
    if (TVar2 == Get) {
      Consume((Token *)&action_1,this);
      std::make_unique<wabt::GetAction,wabt::Location&>((Location *)local_130);
      pGVar5 = std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::operator->
                         ((unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> *)
                          local_130);
      Var::Var(&local_178,this->last_module_index_,(Location *)local_48);
      ParseVarOpt(this,&(pGVar5->super_ActionMixin<(wabt::ActionType)1>).super_Action.module_var,
                  &local_178);
      Var::~Var(&local_178);
      pGVar5 = std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::operator->
                         ((unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> *)
                          local_130);
      local_17c = (Enum)ParseQuotedText(this,&(pGVar5->super_ActionMixin<(wabt::ActionType)1>).
                                              super_Action.name,true);
      bVar1 = Failed((Result)local_17c);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_e0 = 1;
      }
      else {
        std::unique_ptr<wabt::Action,std::default_delete<wabt::Action>>::operator=
                  ((unique_ptr<wabt::Action,std::default_delete<wabt::Action>> *)out_action,
                   (unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> *)local_130);
        local_e0 = 4;
      }
      std::unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_>::~unique_ptr
                ((unique_ptr<wabt::GetAction,_std::default_delete<wabt::GetAction>_> *)local_130);
    }
    else {
      if (TVar2 != Invoke) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"invoke",&local_1e9)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(asStack_1c8,"get",&local_1ea);
        local_1a8 = &local_1e8;
        local_1a0 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_1eb);
        __l._M_len = local_1a0;
        __l._M_array = local_1a8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_198,__l,&local_1eb);
        this_local._4_4_ = ErrorExpected(this,&local_198,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_1eb);
        local_218 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8;
        do {
          local_218 = local_218 + -1;
          std::__cxx11::string::~string((string *)local_218);
        } while (local_218 != &local_1e8);
        std::allocator<char>::~allocator(&local_1ea);
        std::allocator<char>::~allocator(&local_1e9);
        return (Result)this_local._4_4_;
      }
      Consume((Token *)&action,this);
      std::make_unique<wabt::InvokeAction,wabt::Location&>((Location *)local_90);
      pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
               operator->((unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>
                           *)local_90);
      Var::Var(&local_d8,this->last_module_index_,(Location *)local_48);
      ParseVarOpt(this,&(pIVar4->super_ActionMixin<(wabt::ActionType)0>).super_Action.module_var,
                  &local_d8);
      Var::~Var(&local_d8);
      pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
               operator->((unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>
                           *)local_90);
      RVar3 = ParseQuotedText(this,&(pIVar4->super_ActionMixin<(wabt::ActionType)0>).super_Action.
                                    name,true);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_e0 = 1;
      }
      else {
        pIVar4 = std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::
                 operator->((unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>
                             *)local_90);
        RVar3 = ParseConstList(this,&pIVar4->args,Normal);
        bVar1 = Failed(RVar3);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          local_e0 = 1;
        }
        else {
          std::unique_ptr<wabt::Action,std::default_delete<wabt::Action>>::operator=
                    ((unique_ptr<wabt::Action,std::default_delete<wabt::Action>> *)out_action,
                     (unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> *)
                     local_90);
          local_e0 = 4;
        }
      }
      std::unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_>::~unique_ptr
                ((unique_ptr<wabt::InvokeAction,_std::default_delete<wabt::InvokeAction>_> *)
                 local_90);
    }
    if (local_e0 != 1) {
      RVar3 = Expect(this,Rpar);
      bVar1 = Failed(RVar3);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseAction(ActionPtr* out_action) {
  WABT_TRACE(ParseAction);
  EXPECT(Lpar);
  Location loc = GetLocation();

  switch (Peek()) {
    case TokenType::Invoke: {
      Consume();
      auto action = std::make_unique<InvokeAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      CHECK_RESULT(ParseConstList(&action->args, ConstType::Normal));
      *out_action = std::move(action);
      break;
    }

    case TokenType::Get: {
      Consume();
      auto action = std::make_unique<GetAction>(loc);
      ParseVarOpt(&action->module_var, Var(last_module_index_, loc));
      CHECK_RESULT(ParseQuotedText(&action->name));
      *out_action = std::move(action);
      break;
    }

    default:
      return ErrorExpected({"invoke", "get"});
  }
  EXPECT(Rpar);
  return Result::Ok;
}